

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

ssize_t __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::write
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  basic_buffer<wchar_t> *pbVar1;
  size_t sVar2;
  wchar_t *pwVar3;
  int iVar4;
  long in_RAX;
  undefined4 extraout_var;
  ulong uVar5;
  undefined4 in_register_00000034;
  
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar5 = (long)__buf + sVar2;
  if (pbVar1->capacity_ < uVar5) {
    iVar4 = (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar5);
    in_RAX = CONCAT44(extraout_var,iVar4);
  }
  pbVar1->size_ = uVar5;
  if (0 < (long)__buf) {
    pwVar3 = pbVar1->ptr_;
    uVar5 = (long)__buf + 1;
    in_RAX = 0;
    do {
      pwVar3[sVar2 + in_RAX] = (int)*(char *)(CONCAT44(in_register_00000034,__fd) + in_RAX);
      uVar5 = uVar5 - 1;
      in_RAX = in_RAX + 1;
    } while (1 < uVar5);
  }
  return in_RAX;
}

Assistant:

void write(string_view value) {
    auto &&it = reserve(value.size());
    it = internal::copy_str<char_type>(value.begin(), value.end(), it);
  }